

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O1

ON_Sun * __thiscall ON_Sun::operator=(ON_Sun *this,ON_Sun *sun)

{
  CImpl *pCVar1;
  CImpl *pCVar2;
  bool bVar3;
  int minutes;
  double dVar4;
  int d;
  int m;
  int y;
  double h;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  
  if (this != sun) {
    bVar3 = CImpl::EnableOn(sun->_impl);
    CImpl::SetEnableOn(this->_impl,bVar3);
    bVar3 = CImpl::EnableAllowed(sun->_impl);
    CImpl::SetEnableAllowed(this->_impl,bVar3);
    bVar3 = CImpl::EnableOn(sun->_impl);
    CImpl::SetEnableOn(this->_impl,bVar3);
    bVar3 = CImpl::ManualControlAllowed(sun->_impl);
    CImpl::SetManualControlAllowed(this->_impl,bVar3);
    bVar3 = CImpl::ManualControlOn(sun->_impl);
    CImpl::SetManualControlOn(this->_impl,bVar3);
    dVar4 = CImpl::North(sun->_impl);
    CImpl::SetNorth(this->_impl,dVar4);
    bVar3 = CImpl::DaylightSavingOn(sun->_impl);
    CImpl::SetDaylightSavingOn(this->_impl,bVar3);
    minutes = CImpl::DaylightSavingMinutes(sun->_impl);
    CImpl::SetDaylightSavingMinutes(this->_impl,minutes);
    dVar4 = CImpl::Azimuth(sun->_impl);
    CImpl::SetAzimuth(this->_impl,dVar4);
    dVar4 = CImpl::Altitude(sun->_impl);
    CImpl::SetAltitude(this->_impl,dVar4);
    dVar4 = CImpl::Latitude(sun->_impl);
    CImpl::SetLatitude(this->_impl,dVar4);
    dVar4 = CImpl::Longitude(sun->_impl);
    CImpl::SetLongitude(this->_impl,dVar4);
    dVar4 = CImpl::TimeZone(sun->_impl);
    CImpl::SetTimeZone(this->_impl,dVar4);
    dVar4 = CImpl::Intensity(sun->_impl);
    CImpl::SetIntensity(this->_impl,dVar4);
    dVar4 = CImpl::ShadowIntensity(sun->_impl);
    CImpl::SetShadowIntensity(this->_impl,dVar4);
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    local_38 = 0.0;
    CImpl::LocalDateTime(sun->_impl,&local_3c,&local_40,&local_44,&local_38);
    CImpl::SetLocalDateTime(this->_impl,local_3c,local_40,local_44,local_38);
    pCVar1 = sun->_impl;
    pCVar2 = this->_impl;
    pCVar2->_azimuth = pCVar1->_azimuth;
    pCVar2->_altitude = pCVar1->_altitude;
    pCVar2->_calc_dirty = pCVar1->_calc_dirty;
  }
  return this;
}

Assistant:

const ON_Sun& ON_Sun::operator = (const ON_Sun& sun)
{
  if (this != &sun)
  {
    // When copying the object, we need to directly copy the underlying XML. So we can't allow
    // virtual overrides to execute because they might hide the real values we want to copy.
    ON_Sun::SetEnableOn             (sun.ON_Sun::EnableOn());
    ON_Sun::SetEnableAllowed        (sun.ON_Sun::EnableAllowed());
    ON_Sun::SetEnableOn             (sun.ON_Sun::EnableOn());
    ON_Sun::SetManualControlAllowed (sun.ON_Sun::ManualControlAllowed());
    ON_Sun::SetManualControlOn      (sun.ON_Sun::ManualControlOn());
    ON_Sun::SetNorth                (sun.ON_Sun::North());
    ON_Sun::SetDaylightSavingOn     (sun.ON_Sun::DaylightSavingOn());
    ON_Sun::SetDaylightSavingMinutes(sun.ON_Sun::DaylightSavingMinutes());
    ON_Sun::SetAzimuth              (sun.ON_Sun::Azimuth());
    ON_Sun::SetAltitude             (sun.ON_Sun::Altitude());
    ON_Sun::SetLatitude             (sun.ON_Sun::Latitude());
    ON_Sun::SetLongitude            (sun.ON_Sun::Longitude());
    ON_Sun::SetTimeZone             (sun.ON_Sun::TimeZone());
    ON_Sun::SetIntensity            (sun.ON_Sun::Intensity());
    ON_Sun::SetShadowIntensity      (sun.ON_Sun::ShadowIntensity());

    int y = 0, m = 0, d = 0; double h = 0.0;
    sun.ON_Sun::LocalDateTime(y, m, d, h);
    ON_Sun::SetLocalDateTime(y, m, d, h);

    _impl->_azimuth    = sun._impl->_azimuth;
    _impl->_altitude   = sun._impl->_altitude;
    _impl->_calc_dirty = sun._impl->_calc_dirty;
  }

  return *this;
}